

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

size_t propagatemark(global_State *g)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  cTValue *pcVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  GCtab *t;
  GCfunc *fn;
  uint *puVar9;
  GCobj *pGVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar3 = (g->gc).gray.gcptr32;
  fn = (GCfunc *)(ulong)uVar3;
  uVar1 = (fn->c).gct;
  (fn->c).marked = (fn->c).marked | 4;
  (g->gc).gray.gcptr32 = (fn->c).gclist.gcptr32;
  if (uVar1 != '\v') {
    if (uVar1 == '\b') {
      gc_traverse_func(g,fn);
      if ((fn->c).ffid != '\0') {
        return (ulong)(fn->c).nupvalues * 8 + 0x20;
      }
      return (ulong)(fn->c).nupvalues * 4 + 0x14;
    }
    if (uVar1 == '\a') {
      gc_traverse_proto(g,(GCproto *)&fn->c);
      return (ulong)(fn->c).upvalue[0].u32.lo;
    }
    if (uVar1 == '\x06') {
      (fn->c).gclist.gcptr32 = (g->gc).grayagain.gcptr32;
      (g->gc).grayagain.gcptr32 = uVar3;
      (fn->c).marked = (fn->c).marked & 0xfb;
      gc_traverse_thread(g,(lua_State *)&fn->c);
      return (ulong)*(uint *)((long)fn + 0x38) * 8 + 0x40;
    }
    gc_traverse_trace(g,(GCtrace *)&fn->c);
    return (ulong)*(ushort *)((long)&(fn->c).f + 6) * 4 +
           ((ulong)*(ushort *)((long)&(fn->c).f + 4) +
           (ulong)((fn->c).env.gcptr32 - *(int *)&(fn->c).f)) * 8 + 0x60;
  }
  pGVar10 = (GCobj *)(ulong)(fn->c).pc.ptr32;
  uVar8 = 0;
  if (pGVar10 == (GCobj *)0x0) {
LAB_001153d0:
    uVar3 = *(uint *)&(fn->c).f;
    bVar4 = true;
    if ((ulong)uVar3 != 0) {
      uVar11 = 0;
      do {
        uVar7 = (ulong)(fn->c).env.gcptr32;
        if ((*(int *)(uVar7 + 4 + uVar11 * 8) + 0xdU < 9) &&
           (pGVar10 = (GCobj *)(ulong)*(uint *)(uVar7 + uVar11 * 8),
           ((pGVar10->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar10);
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
LAB_0011540d:
    uVar3 = *(uint *)((long)&(fn->c).f + 4);
    if (uVar3 != 0) {
      uVar11 = (ulong)(fn->l).uvptr[0].gcptr32;
      uVar7 = 0;
      do {
        if (*(int *)(uVar11 + 4 + uVar7 * 0x18) != -1) {
          puVar9 = (uint *)(uVar7 * 0x18 + uVar11);
          if ((((uVar8 & 8) == 0) && (puVar9[3] + 0xd < 9)) &&
             (((((GCobj *)(ulong)puVar9[2])->gch).marked & 3) != 0)) {
            gc_mark(g,(GCobj *)(ulong)puVar9[2]);
          }
          if (((bVar4) && (puVar9[1] + 0xd < 9)) &&
             (((((GCobj *)(ulong)*puVar9)->gch).marked & 3) != 0)) {
            gc_mark(g,(GCobj *)(ulong)*puVar9);
          }
        }
        uVar12 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar12;
      } while (uVar12 <= uVar3);
    }
    if ((int)uVar8 < 1) goto LAB_00115499;
  }
  else {
    if (((pGVar10->gch).marked & 3) != 0) {
      gc_mark(g,pGVar10);
    }
    uVar8 = 0;
    if (((pGVar10->gch).unused1 & 8) != 0) goto LAB_001153d0;
    pcVar5 = lj_meta_cache(&pGVar10->tab,MM_mode,(GCstr *)(ulong)g->gcroot[3].gcptr32);
    if (pcVar5 == (cTValue *)0x0) {
      uVar8 = 0;
      goto LAB_001153d0;
    }
    uVar8 = 0;
    if ((pcVar5->field_2).it != 0xfffffffb) goto LAB_001153d0;
    pbVar6 = (byte *)((ulong)(pcVar5->u32).lo + 0x10);
    uVar8 = 0;
    while( true ) {
      while( true ) {
        bVar2 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        if (bVar2 < 0x6b) break;
        if (bVar2 == 0x76) {
          uVar8 = uVar8 | 0x10;
        }
        else if (bVar2 == 0x6b) {
          uVar8 = uVar8 | 8;
        }
      }
      if (bVar2 == 0) break;
      if (bVar2 == 0x4b) {
        uVar8 = 0xffffffef;
      }
    }
    if ((int)uVar8 < 1) {
LAB_001153c7:
      if ((uVar8 & 0x10) == 0) goto LAB_001153d0;
      bVar4 = false;
      goto LAB_0011540d;
    }
    (fn->c).marked = (byte)uVar8 | (fn->c).marked & 0xe7;
    (fn->c).gclist.gcptr32 = (g->gc).weak.gcptr32;
    (g->gc).weak.gcptr32 = uVar3;
    if (uVar8 != 0x18) goto LAB_001153c7;
  }
  (fn->c).marked = (fn->c).marked & 0xfb;
LAB_00115499:
  return (ulong)(*(int *)((long)&(fn->c).f + 4) + 1) * 0x18 + (ulong)*(uint *)&(fn->c).f * 8 + 0x20;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lua_assert(isgray(o));
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   sizeof(Node) * (t->hmask + 1);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lua_assert(0);
    return 0;
#endif
  }
}